

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormat::touch(DecimalFormat *this,UErrorCode *status)

{
  DecimalFormatFields *pDVar1;
  DecimalFormatFields *pDVar2;
  bool bVar3;
  DecimalFormatSymbols *pDVar4;
  LocalizedNumberFormatter *__return_storage_ptr__;
  DecimalFormatProperties *pDVar5;
  DecimalFormatProperties *exportedProperties;
  __pointer_type pNVar6;
  char16_t *theCurrency;
  LocalizedNumberFormatter *local_310;
  CurrencyUnit local_300;
  byte local_2dd;
  UnlocalizedNumberFormatter local_2d0;
  undefined1 local_101;
  LocalizedNumberFormatter *local_100;
  undefined1 local_f8 [8];
  Locale locale;
  UErrorCode *status_local;
  DecimalFormat *this_local;
  
  locale._216_8_ = status;
  bVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator==
                    (&(this->fields->exportedProperties).
                      super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>,
                     (DecimalFormatProperties *)0x0);
  if (!bVar3) {
    pDVar4 = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::operator->
                       (&(this->fields->symbols).
                         super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>);
    DecimalFormatSymbols::getLocale((Locale *)local_f8,pDVar4);
    pDVar1 = this->fields;
    __return_storage_ptr__ =
         (LocalizedNumberFormatter *)UMemory::operator_new((UMemory *)0x1d0,(size_t)pDVar4);
    local_2dd = 0;
    local_310 = (LocalizedNumberFormatter *)0x0;
    if (__return_storage_ptr__ != (LocalizedNumberFormatter *)0x0) {
      local_101 = 1;
      local_100 = __return_storage_ptr__;
      pDVar5 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator*
                         ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                          this->fields);
      pDVar4 = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::operator*
                         (&(this->fields->symbols).
                           super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>);
      pDVar2 = this->fields;
      exportedProperties =
           LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator*
                     (&(pDVar2->exportedProperties).
                       super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>);
      icu_63::number::impl::NumberPropertyMapper::create
                (&local_2d0,pDVar5,pDVar4,&pDVar2->warehouse,exportedProperties,
                 (UErrorCode *)locale._216_8_);
      local_2dd = 1;
      icu_63::number::UnlocalizedNumberFormatter::locale
                (__return_storage_ptr__,&local_2d0,(Locale *)local_f8);
      local_310 = __return_storage_ptr__;
    }
    local_101 = 0;
    LocalPointer<const_icu_63::number::LocalizedNumberFormatter>::adoptInstead
              (&pDVar1->formatter,local_310);
    if ((local_2dd & 1) != 0) {
      icu_63::number::UnlocalizedNumberFormatter::~UnlocalizedNumberFormatter(&local_2d0);
    }
    setupFastFormat(this);
    pNVar6 = std::atomic<icu_63::numparse::impl::NumberParserImpl_*>::exchange
                       (&this->fields->atomicParser,(__pointer_type)0x0,memory_order_seq_cst);
    if (pNVar6 != (__pointer_type)0x0) {
      (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[1])();
    }
    pNVar6 = std::atomic<icu_63::numparse::impl::NumberParserImpl_*>::exchange
                       (&this->fields->atomicCurrencyParser,(__pointer_type)0x0,memory_order_seq_cst
                       );
    if (pNVar6 != (__pointer_type)0x0) {
      (*(pNVar6->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[1])();
    }
    pDVar5 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       (&(this->fields->exportedProperties).
                         super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>);
    icu_63::number::impl::NullableValue<icu_63::CurrencyUnit>::get
              (&local_300,&pDVar5->currency,(UErrorCode *)locale._216_8_);
    theCurrency = CurrencyUnit::getISOCurrency(&local_300);
    NumberFormat::setCurrency(&this->super_NumberFormat,theCurrency,(UErrorCode *)locale._216_8_);
    CurrencyUnit::~CurrencyUnit(&local_300);
    pDVar5 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       (&(this->fields->exportedProperties).
                         super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>);
    NumberFormat::setMaximumIntegerDigits(&this->super_NumberFormat,pDVar5->maximumIntegerDigits);
    pDVar5 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       (&(this->fields->exportedProperties).
                         super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>);
    NumberFormat::setMinimumIntegerDigits(&this->super_NumberFormat,pDVar5->minimumIntegerDigits);
    pDVar5 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       (&(this->fields->exportedProperties).
                         super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>);
    NumberFormat::setMaximumFractionDigits(&this->super_NumberFormat,pDVar5->maximumFractionDigits);
    pDVar5 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       (&(this->fields->exportedProperties).
                         super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>);
    NumberFormat::setMinimumFractionDigits(&this->super_NumberFormat,pDVar5->minimumFractionDigits);
    pDVar5 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    NumberFormat::setGroupingUsed(&this->super_NumberFormat,pDVar5->groupingUsed & 1);
    Locale::~Locale((Locale *)local_f8);
  }
  return;
}

Assistant:

void DecimalFormat::touch(UErrorCode& status) {
    if (fields->exportedProperties == nullptr) {
        // fields->exportedProperties is null only when the formatter is not ready yet.
        // The only time when this happens is during legacy deserialization.
        return;
    }

    // In C++, fields->symbols is the source of truth for the locale.
    Locale locale = fields->symbols->getLocale();

    // Note: The formatter is relatively cheap to create, and we need it to populate fields->exportedProperties,
    // so automatically compute it here. The parser is a bit more expensive and is not needed until the
    // parse method is called, so defer that until needed.
    // TODO: Only update the pieces that changed instead of re-computing the whole formatter?
    fields->formatter.adoptInstead(
            new LocalizedNumberFormatter(
                    NumberPropertyMapper::create(
                            *fields->properties, *fields->symbols, fields->warehouse, *fields->exportedProperties, status).locale(
                            locale)));

    // Do this after fields->exportedProperties are set up
    setupFastFormat();

    // Delete the parsers if they were made previously
    delete fields->atomicParser.exchange(nullptr);
    delete fields->atomicCurrencyParser.exchange(nullptr);

    // In order for the getters to work, we need to populate some fields in NumberFormat.
    NumberFormat::setCurrency(fields->exportedProperties->currency.get(status).getISOCurrency(), status);
    NumberFormat::setMaximumIntegerDigits(fields->exportedProperties->maximumIntegerDigits);
    NumberFormat::setMinimumIntegerDigits(fields->exportedProperties->minimumIntegerDigits);
    NumberFormat::setMaximumFractionDigits(fields->exportedProperties->maximumFractionDigits);
    NumberFormat::setMinimumFractionDigits(fields->exportedProperties->minimumFractionDigits);
    // fImpl->properties, not fields->exportedProperties, since this information comes from the pattern:
    NumberFormat::setGroupingUsed(fields->properties->groupingUsed);
}